

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexCubeShader::TexCubeShader(TexCubeShader *this,CubeFace face)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_2f1;
  allocator<char> local_2f0;
  allocator<char> local_2ef;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  FragmentOutput local_2ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  FragmentSource local_268;
  string local_248 [32];
  VertexSource local_228;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  VertexToFragmentVarying local_1a8;
  Uniform local_1a0;
  VertexAttribute local_178;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"a_position",&local_2ed);
  std::__cxx11::string::string((string *)&local_150,local_1c8);
  local_150.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"a_coord",&local_2ee);
  std::__cxx11::string::string((string *)&local_178,local_1e8);
  local_178.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_178);
  local_1a8.type = GENERICVECTYPE_FLOAT;
  local_1a8.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a8);
  local_2ec.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2ec);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"u_sampler0",&local_2ef);
  std::__cxx11::string::string((string *)&local_1a0,local_208);
  local_1a0.type = TYPE_SAMPLER_CUBE;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_2f0);
  std::__cxx11::string::string((string *)&local_228,local_248);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,glcts::fixed_sample_locations_values + 1,&local_2f1);
  std::operator+(&local_2c8,&local_2e8,
                 "uniform samplerCube u_sampler0;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tmediump float x = v_coord.x*2.0 - 1.0;\n\tmediump float y = v_coord.y*2.0 - 1.0;\n\tgl_FragColor = textureCube(u_sampler0, "
                );
  std::operator+(&local_2a8,&local_2c8,
                 _ZN4deqp5gles210FunctionalL14s_cubeSwizzlesE_rel +
                 *(int *)(_ZN4deqp5gles210FunctionalL14s_cubeSwizzlesE_rel + (ulong)face * 4));
  std::operator+(&local_288,&local_2a8,");\n}\n");
  std::__cxx11::string::string((string *)&local_268,(string *)&local_288);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_268);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_1c8);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e1bf90;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e1bfc8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e1bfe0;
  *(CubeFace *)&(this->super_ShaderProgram).field_0x154 = face;
  return;
}

Assistant:

TexCubeShader (tcu::CubeFace face)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_CUBE)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource(string("") +
												  "uniform samplerCube u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	mediump float x = v_coord.x*2.0 - 1.0;\n"
												  "	mediump float y = v_coord.y*2.0 - 1.0;\n"
												  "	gl_FragColor = textureCube(u_sampler0, " + s_cubeSwizzles[face] + ");\n"
												  "}\n"))
		, m_face(face)
	{
	}